

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sglrReferenceContext.cpp
# Opt level: O3

void __thiscall
sglr::ReferenceContext::vertexAttribIPointer
          (ReferenceContext *this,deUint32 index,int size,deUint32 type,int stride,void *pointer)

{
  int *piVar1;
  VertexArray *pVVar2;
  DataBuffer *pDVar3;
  pointer pVVar4;
  VertexArray *pVVar5;
  
  if ((index < (uint)(this->m_limits).maxVertexAttribs) && (0xfffffffb < size - 5U)) {
    if (type - 0x1406 < 0xfffffffa) {
      if (this->m_lastError != 0) {
        return;
      }
      this->m_lastError = 0x500;
      return;
    }
    if (-1 < stride) {
      pVVar2 = this->m_vertexArrayBinding;
      pDVar3 = this->m_arrayBufferBinding;
      if ((pVVar2 != (VertexArray *)0x0) && (pointer != (void *)0x0 && pDVar3 == (DataBuffer *)0x0))
      {
        if (this->m_lastError != 0) {
          return;
        }
        this->m_lastError = 0x502;
        return;
      }
      pVVar5 = &this->m_clientVertexArray;
      if (pVVar2 != (VertexArray *)0x0) {
        pVVar5 = pVVar2;
      }
      pVVar4 = (pVVar5->m_arrays).
               super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pVVar4[index].size = size;
      pVVar4[index].stride = stride;
      pVVar4[index].type = type;
      pVVar4[index].normalized = false;
      pVVar4[index].integer = true;
      pVVar4[index].pointer = pointer;
      if (pDVar3 != (DataBuffer *)0x0) {
        piVar1 = &(pDVar3->super_NamedObject).m_refCount;
        *piVar1 = *piVar1 + 1;
      }
      if (pVVar4[index].bufferBinding != (DataBuffer *)0x0) {
        rc::ObjectManager<sglr::rc::DataBuffer>::releaseReference
                  (&this->m_buffers,pVVar4[index].bufferBinding);
        pVVar4 = (pVVar5->m_arrays).
                 super__Vector_base<sglr::rc::VertexArray::VertexAttribArray,_std::allocator<sglr::rc::VertexArray::VertexAttribArray>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        pDVar3 = this->m_arrayBufferBinding;
      }
      pVVar4[index].bufferDeleted = false;
      pVVar4[index].bufferBinding = pDVar3;
      return;
    }
  }
  if (this->m_lastError == 0) {
    this->m_lastError = 0x501;
  }
  return;
}

Assistant:

void ReferenceContext::vertexAttribIPointer (deUint32 index, int size, deUint32 type, int stride, const void *pointer)
{
	RC_IF_ERROR(index >= (deUint32)m_limits.maxVertexAttribs, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(size <= 0 || size > 4, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(type != GL_BYTE					&&	type != GL_UNSIGNED_BYTE	&&
				type != GL_SHORT				&&	type != GL_UNSIGNED_SHORT	&&
				type != GL_INT					&&	type != GL_UNSIGNED_INT, GL_INVALID_ENUM, RC_RET_VOID);
	RC_IF_ERROR(stride < 0, GL_INVALID_VALUE, RC_RET_VOID);
	RC_IF_ERROR(m_vertexArrayBinding != DE_NULL && m_arrayBufferBinding == DE_NULL && pointer != DE_NULL, GL_INVALID_OPERATION, RC_RET_VOID);

	rc::VertexArray& vao = (m_vertexArrayBinding) ? (*m_vertexArrayBinding) : (m_clientVertexArray);

	vao.m_arrays[index].size			= size;
	vao.m_arrays[index].stride			= stride;
	vao.m_arrays[index].type			= type;
	vao.m_arrays[index].normalized		= false;
	vao.m_arrays[index].integer			= true;
	vao.m_arrays[index].pointer			= pointer;

	// acquire new reference
	if (m_arrayBufferBinding)
		m_buffers.acquireReference(m_arrayBufferBinding);

	// release old reference
	if (vao.m_arrays[index].bufferBinding)
		m_buffers.releaseReference(vao.m_arrays[index].bufferBinding);

	vao.m_arrays[index].bufferDeleted	= false;
	vao.m_arrays[index].bufferBinding	= m_arrayBufferBinding;
}